

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_diff.cpp
# Opt level: O0

void __thiscall argparse::args_t::~args_t(args_t *this)

{
  long *in_RDI;
  
  if ((in_RDI[2] != 0) && (in_RDI[2] != _stdout)) {
    fclose((FILE *)in_RDI[2]);
  }
  if ((in_RDI[1] != 0) && (in_RDI[1] != _stdin)) {
    fclose((FILE *)in_RDI[1]);
  }
  if (*in_RDI != 0) {
    fclose((FILE *)*in_RDI);
  }
  return;
}

Assistant:

args_t::~args_t() {
        if ( output && output != stdout )
            fclose( output );
        
        if ( input_add && input_add != stdin)
            fclose (input_add);
        
        if ( input_master )
            fclose (input_master);
        
    }